

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_symbols.hpp
# Opt level: O0

bool __thiscall
ELFIO::symbol_section_accessor_template<const_ELFIO::section>::generic_get_symbol<ELFIO::Elf32_Sym>
          (symbol_section_accessor_template<const_ELFIO::section> *this,Elf_Xword index,string *name
          ,Elf64_Addr *value,Elf_Xword *size,uchar *bind,uchar *type,Elf_Half *section_index,
          uchar *other)

{
  elfio *this_00;
  Elf_Half EVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  undefined4 extraout_var;
  Elf_Xword EVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  endianness_convertor *this_01;
  char *pcVar7;
  uint32_t *puVar8;
  char *pStr;
  string_section_accessor str_reader;
  section *string_section;
  endianness_convertor *convertor;
  Elf32_Sym *pSym;
  bool ret;
  uchar *bind_local;
  Elf_Xword *size_local;
  Elf64_Addr *value_local;
  string *name_local;
  Elf_Xword index_local;
  symbol_section_accessor_template<const_ELFIO::section> *this_local;
  
  pSym._7_1_ = false;
  iVar3 = (*this->symbol_section->_vptr_section[0x18])();
  if (CONCAT44(extraout_var,iVar3) != 0) {
    EVar6 = get_symbols_num(this);
    if (index < EVar6) {
      iVar3 = (*this->symbol_section->_vptr_section[0x18])();
      iVar4 = (*this->symbol_section->_vptr_section[0xf])();
      puVar8 = (uint32_t *)
               (CONCAT44(extraout_var_00,iVar3) + index * CONCAT44(extraout_var_01,iVar4));
      this_01 = elfio::get_convertor(this->elf_file);
      this_00 = this->elf_file;
      EVar1 = get_string_table_index(this);
      str_reader.string_section = elfio::Sections::operator[](&this_00->sections,(uint)EVar1);
      string_section_accessor_template<ELFIO::section>::string_section_accessor_template
                ((string_section_accessor_template<ELFIO::section> *)&pStr,str_reader.string_section
                );
      uVar5 = endianness_convertor::operator()(this_01,*puVar8);
      pcVar7 = string_section_accessor_template<ELFIO::section>::get_string
                         ((string_section_accessor_template<ELFIO::section> *)&pStr,uVar5);
      if (pcVar7 != (char *)0x0) {
        std::__cxx11::string::operator=((string *)name,pcVar7);
      }
      uVar5 = endianness_convertor::operator()(this_01,puVar8[1]);
      *value = (ulong)uVar5;
      uVar5 = endianness_convertor::operator()(this_01,puVar8[2]);
      *size = (ulong)uVar5;
      *bind = (uchar)((int)(uint)(byte)puVar8[3] >> 4);
      *type = (byte)puVar8[3] & 0xf;
      uVar2 = endianness_convertor::operator()(this_01,*(uint16_t *)((long)puVar8 + 0xe));
      *section_index = uVar2;
      *other = *(uchar *)((long)puVar8 + 0xd);
      pSym._7_1_ = true;
    }
  }
  return pSym._7_1_;
}

Assistant:

bool generic_get_symbol( Elf_Xword      index,
                             std::string&   name,
                             Elf64_Addr&    value,
                             Elf_Xword&     size,
                             unsigned char& bind,
                             unsigned char& type,
                             Elf_Half&      section_index,
                             unsigned char& other ) const
    {
        bool ret = false;

        if ( nullptr != symbol_section->get_data() &&
             index < get_symbols_num() ) {
            const auto* pSym = reinterpret_cast<const T*>(
                symbol_section->get_data() +
                index * symbol_section->get_entry_size() );

            const endianness_convertor& convertor = elf_file.get_convertor();

            section* string_section =
                elf_file.sections[get_string_table_index()];
            string_section_accessor str_reader( string_section );
            const char*             pStr =
                str_reader.get_string( convertor( pSym->st_name ) );
            if ( nullptr != pStr ) {
                name = pStr;
            }
            value         = convertor( pSym->st_value );
            size          = convertor( pSym->st_size );
            bind          = ELF_ST_BIND( pSym->st_info );
            type          = ELF_ST_TYPE( pSym->st_info );
            section_index = convertor( pSym->st_shndx );
            other         = pSym->st_other;

            ret = true;
        }

        return ret;
    }